

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubroutineSymbols.cpp
# Opt level: O1

bool __thiscall
slang::ast::MethodPrototypeSymbol::checkMethodMatch
          (MethodPrototypeSymbol *this,Scope *scope,SubroutineSymbol *method)

{
  size_t sVar1;
  pointer ppFVar2;
  pointer ppFVar3;
  long lVar4;
  size_t __n;
  long lVar5;
  size_t sVar6;
  SyntaxNode *this_00;
  bool bVar7;
  bool bVar8;
  int iVar9;
  Type *pTVar10;
  Type *pTVar11;
  Diagnostic *pDVar12;
  Diagnostic *pDVar13;
  char *pcVar14;
  long lVar15;
  size_t sVar16;
  SourceRange sourceRange;
  string_view arg;
  
  if (method->subroutineKind == this->subroutineKind) {
    pTVar10 = DeclaredType::getType(&this->declaredReturnType);
    pTVar11 = DeclaredType::getType(&method->declaredReturnType);
    bVar7 = Type::isMatching(pTVar11,pTVar10);
    if (!bVar7) {
      if (pTVar11->canonical == (Type *)0x0) {
        Type::resolveCanonical(pTVar11);
      }
      if ((pTVar11->canonical->super_Symbol).kind != ErrorType) {
        if (pTVar10->canonical == (Type *)0x0) {
          Type::resolveCanonical(pTVar10);
        }
        if ((pTVar10->canonical->super_Symbol).kind != ErrorType) {
          this_00 = (SyntaxNode *)(this->declaredReturnType).typeOrLink.typeSyntax;
          if (this_00 == (SyntaxNode *)0x0 || *(int *)&(this->declaredReturnType).field_0x3c < 0) {
            pDVar13 = Scope::addDiag(scope,(DiagCode)0x760006,(this->super_Symbol).location);
          }
          else {
            sourceRange = slang::syntax::SyntaxNode::sourceRange(this_00);
            pDVar13 = Scope::addDiag(scope,(DiagCode)0x760006,sourceRange);
          }
          ast::operator<<(pDVar13,pTVar11);
          Diagnostic::operator<<(pDVar13,(method->super_Symbol).name);
          ast::operator<<(pDVar13,pTVar10);
          this = (MethodPrototypeSymbol *)method;
          goto LAB_00243ba2;
        }
      }
    }
    if ((method->super_Scope).deferredMemberIndex != Invalid) {
      Scope::elaborate(&method->super_Scope);
    }
    sVar1 = (method->arguments)._M_extent._M_extent_value;
    if (sVar1 == (this->arguments)._M_extent._M_extent_value) {
      bVar7 = sVar1 == 0;
      if (bVar7) {
        return bVar7;
      }
      ppFVar2 = (method->arguments)._M_ptr;
      ppFVar3 = (this->arguments)._M_ptr;
      lVar15 = 0;
      do {
        lVar4 = *(long *)((long)ppFVar2 + lVar15);
        __n = *(size_t *)(lVar4 + 8);
        if (__n == 0) {
          bVar8 = false;
        }
        else {
          lVar5 = *(long *)((long)ppFVar3 + lVar15);
          sVar6 = *(size_t *)(lVar5 + 8);
          if (__n == sVar6) {
            iVar9 = bcmp(*(void **)(lVar4 + 0x10),*(void **)(lVar5 + 0x10),__n);
            if ((sVar6 == 0) || (iVar9 == 0)) goto LAB_0024399b;
LAB_00243a42:
            pDVar13 = Scope::addDiag(scope,(DiagCode)0x720006,*(SourceLocation *)(lVar4 + 0x18));
            pDVar12 = Diagnostic::operator<<(pDVar13,*(string_view *)(lVar4 + 8));
            sVar16 = *(size_t *)(lVar5 + 8);
            pcVar14 = *(char **)(lVar5 + 0x10);
LAB_00243a70:
            arg._M_str = pcVar14;
            arg._M_len = sVar16;
            Diagnostic::operator<<(pDVar12,arg);
          }
          else {
            if (sVar6 != 0) goto LAB_00243a42;
LAB_0024399b:
            pTVar10 = DeclaredType::getType((DeclaredType *)(lVar4 + 0x40));
            pTVar11 = DeclaredType::getType((DeclaredType *)(lVar5 + 0x40));
            bVar8 = Type::isMatching(pTVar10,pTVar11);
            if (bVar8) {
LAB_002439fc:
              bVar8 = false;
              if (*(int *)(lVar4 + 0x158) == *(int *)(lVar5 + 0x158)) goto LAB_00243a93;
              pDVar12 = Scope::addDiag(scope,(DiagCode)0x710006,*(SourceLocation *)(lVar4 + 0x18));
              sVar16 = *(size_t *)(lVar4 + 8);
              pcVar14 = *(char **)(lVar4 + 0x10);
              pDVar13 = pDVar12;
              goto LAB_00243a70;
            }
            if (pTVar10->canonical == (Type *)0x0) {
              Type::resolveCanonical(pTVar10);
            }
            if ((pTVar10->canonical->super_Symbol).kind == ErrorType) goto LAB_002439fc;
            if (pTVar11->canonical == (Type *)0x0) {
              Type::resolveCanonical(pTVar11);
            }
            if ((pTVar11->canonical->super_Symbol).kind == ErrorType) goto LAB_002439fc;
            pDVar13 = Scope::addDiag(scope,(DiagCode)0x740006,*(SourceLocation *)(lVar4 + 0x18));
            pDVar12 = Diagnostic::operator<<(pDVar13,*(string_view *)(lVar4 + 8));
            pDVar12 = ast::operator<<(pDVar12,pTVar10);
            ast::operator<<(pDVar12,pTVar11);
          }
          Diagnostic::addNote(pDVar13,(DiagCode)0x50001,*(SourceLocation *)(lVar5 + 0x18));
          bVar8 = true;
        }
LAB_00243a93:
        if (bVar8) {
          return bVar7;
        }
        lVar15 = lVar15 + 8;
        bVar7 = sVar1 << 3 == lVar15;
        if (bVar7) {
          return bVar7;
        }
      } while( true );
    }
    pDVar13 = Scope::addDiag(scope,(DiagCode)0x6f0006,(method->super_Symbol).location);
    Diagnostic::operator<<(pDVar13,(this->super_Symbol).name);
  }
  else {
    pDVar13 = Scope::addDiag(scope,(DiagCode)0x750006,(this->super_Symbol).location);
    this = (MethodPrototypeSymbol *)method;
  }
LAB_00243ba2:
  Diagnostic::addNote(pDVar13,(DiagCode)0x50001,(((SubroutineSymbol *)this)->super_Symbol).location)
  ;
  return false;
}

Assistant:

bool MethodPrototypeSymbol::checkMethodMatch(const Scope& scope,
                                             const SubroutineSymbol& method) const {
    if (method.subroutineKind != subroutineKind) {
        auto& diag = scope.addDiag(diag::MethodKindMismatch, location);
        diag.addNote(diag::NoteDeclarationHere, method.location);
        return false;
    }

    // Check that return type and arguments match what was declared in the prototype.
    auto& protoRetType = getReturnType();
    auto& defRetType = method.getReturnType();
    if (!defRetType.isMatching(protoRetType) && !defRetType.isError() && !protoRetType.isError()) {
        Diagnostic* diag;
        auto typeSyntax = declaredReturnType.getTypeSyntax();
        if (typeSyntax)
            diag = &scope.addDiag(diag::MethodReturnMismatch, typeSyntax->sourceRange());
        else
            diag = &scope.addDiag(diag::MethodReturnMismatch, location);

        (*diag) << defRetType;
        (*diag) << method.name;
        (*diag) << protoRetType;
        diag->addNote(diag::NoteDeclarationHere, method.location);
        return false;
    }

    auto defArgs = method.getArguments();
    auto protoArgs = arguments;
    if (defArgs.size() != protoArgs.size()) {
        auto& diag = scope.addDiag(diag::MethodArgCountMismatch, method.location);
        diag << name;
        diag.addNote(diag::NoteDeclarationHere, location);
        return false;
    }

    for (auto di = defArgs.begin(), pi = protoArgs.begin(); di != defArgs.end(); di++, pi++) {
        // Names must be identical.
        const FormalArgumentSymbol* da = *di;
        const FormalArgumentSymbol* pa = *pi;

        // The subroutine itself shouldn't have empty argument names.
        // If it does the parser already errored.
        if (da->name.empty())
            continue;

        if (da->name != pa->name && !pa->name.empty()) {
            auto& diag = scope.addDiag(diag::MethodArgNameMismatch, da->location);
            diag << da->name << pa->name;
            diag.addNote(diag::NoteDeclarationHere, pa->location);
            return false;
        }

        // Types must match.
        const Type& dt = da->getType();
        const Type& pt = pa->getType();
        if (!dt.isMatching(pt) && !dt.isError() && !pt.isError()) {
            auto& diag = scope.addDiag(diag::MethodArgTypeMismatch, da->location);
            diag << da->name << dt << pt;
            diag.addNote(diag::NoteDeclarationHere, pa->location);
            return false;
        }

        // Direction must match.
        if (da->direction != pa->direction) {
            auto& diag = scope.addDiag(diag::MethodArgDirectionMismatch, da->location);
            diag << da->name;
            diag.addNote(diag::NoteDeclarationHere, pa->location);
            return false;
        }
    }

    return true;
}